

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

bool absl::str_format_internal::anon_unknown_0::FallbackToSnprintf<double>
               (double v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  string_view v_00;
  string_view v_01;
  FormatConversionChar c;
  char cVar1;
  int iVar2;
  size_t __maxlen;
  ulong uVar3;
  ulong uVar4;
  FormatConversionSpecImpl *extraout_RDX;
  FormatConversionSpecImpl *extraout_RDX_00;
  FormatConversionSpecImpl *spec;
  char *pcVar5;
  string_view v_02;
  uint local_108;
  uint local_104;
  basic_string_view<char,_std::char_traits<char>_> local_f0;
  undefined4 local_e0;
  int local_dc;
  undefined1 auStack_d8 [4];
  int n;
  string_view result;
  string local_c0 [8];
  string space;
  size_t local_98;
  string local_90;
  undefined1 local_70 [16];
  char *local_60;
  char *fp;
  char fmt [32];
  int p;
  int w;
  FormatSinkImpl *sink_local;
  FormatConversionSpecImpl *conv_local;
  double v_local;
  
  iVar2 = FormatConversionSpecImpl::width(conv);
  if (iVar2 < 0) {
    local_104 = 0;
  }
  else {
    local_104 = FormatConversionSpecImpl::width(conv);
  }
  iVar2 = FormatConversionSpecImpl::precision(conv);
  if (iVar2 < 0) {
    local_108 = 0xffffffff;
    spec = extraout_RDX;
  }
  else {
    local_108 = FormatConversionSpecImpl::precision(conv);
    spec = extraout_RDX_00;
  }
  pcVar5 = (char *)((long)&fp + 1);
  fp._0_1_ = 0x25;
  local_60 = pcVar5;
  FormatConversionSpecImplFriend::FlagsToString_abi_cxx11_
            (&local_90,(FormatConversionSpecImplFriend *)conv,spec);
  local_70 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_90);
  v_01._M_str = local_60;
  v_01._M_len = local_70._8_8_;
  local_60 = CopyStringTo(local_70._0_8_,v_01,pcVar5);
  std::__cxx11::string::~string((string *)&local_90);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&space.field_2 + 8),"*.*");
  v_02._M_str = local_60;
  v_02._M_len = local_98;
  local_60 = CopyStringTo((anon_unknown_0 *)space.field_2._8_8_,v_02,pcVar5);
  c = FormatConversionSpecImpl::conversion_char(conv);
  cVar1 = FormatConversionCharToChar(c);
  pcVar5 = local_60 + 1;
  *local_60 = cVar1;
  *pcVar5 = '\0';
  local_60 = pcVar5;
  if (fmt + 0x18 <= pcVar5) {
    __assert_fail("fp < fmt + sizeof(fmt)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O0/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                  ,0x3d1,
                  "bool absl::str_format_internal::(anonymous namespace)::FallbackToSnprintf(const Float, const FormatConversionSpecImpl &, FormatSinkImpl *) [Float = double]"
                 );
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,0x200,'\0',(allocator<char> *)((long)&result._M_str + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&result._M_str + 7));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d8);
  do {
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_c0);
    __maxlen = std::__cxx11::string::size();
    local_dc = snprintf(pcVar5,__maxlen,(char *)&fp,v,(ulong)local_104,(ulong)local_108);
    if (local_dc < 0) {
      v_local._7_1_ = false;
LAB_001efba5:
      local_e0 = 1;
      std::__cxx11::string::~string(local_c0);
      return v_local._7_1_;
    }
    uVar3 = (ulong)local_dc;
    uVar4 = std::__cxx11::string::size();
    if (uVar3 < uVar4) {
      pcVar5 = (char *)std::__cxx11::string::data();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_f0,pcVar5,(long)local_dc);
      _auStack_d8 = local_f0._M_len;
      result._M_len = (size_t)local_f0._M_str;
      v_00._M_str = local_f0._M_str;
      v_00._M_len = local_f0._M_len;
      FormatSinkImpl::Append(sink,v_00);
      v_local._7_1_ = true;
      goto LAB_001efba5;
    }
    std::__cxx11::string::resize((ulong)local_c0);
  } while( true );
}

Assistant:

bool FallbackToSnprintf(const Float v, const FormatConversionSpecImpl &conv,
                        FormatSinkImpl *sink) {
  int w = conv.width() >= 0 ? conv.width() : 0;
  int p = conv.precision() >= 0 ? conv.precision() : -1;
  char fmt[32];
  {
    char *fp = fmt;
    *fp++ = '%';
    fp = CopyStringTo(FormatConversionSpecImplFriend::FlagsToString(conv), fp);
    fp = CopyStringTo("*.*", fp);
    if (std::is_same<long double, Float>()) {
      *fp++ = 'L';
    }
    *fp++ = FormatConversionCharToChar(conv.conversion_char());
    *fp = 0;
    assert(fp < fmt + sizeof(fmt));
  }
  std::string space(512, '\0');
  absl::string_view result;
  while (true) {
    int n = snprintf(&space[0], space.size(), fmt, w, p, v);
    if (n < 0) return false;
    if (static_cast<size_t>(n) < space.size()) {
      result = absl::string_view(space.data(), static_cast<size_t>(n));
      break;
    }
    space.resize(static_cast<size_t>(n) + 1);
  }
  sink->Append(result);
  return true;
}